

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

PassToken spvtools::CreateCCPPass(void)

{
  MemPass *this;
  undefined8 *puVar1;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  in_RDI;
  
  this = (MemPass *)operator_new(0x130);
  memset(this,0,0x130);
  opt::MemPass::MemPass(this);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__CCPPass_003eec10;
  *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    **)&this[1].super_Pass.consumer_.super__Function_base._M_functor = &this[1].seen_target_vars_;
  *(undefined8 *)((long)&this[1].super_Pass.consumer_.super__Function_base._M_functor + 8) = 1;
  this[1].super_Pass.consumer_.super__Function_base._M_manager = (_Manager_type)0x0;
  this[1].super_Pass.consumer_._M_invoker = (_Invoker_type)0x0;
  *(undefined4 *)&this[1].super_Pass.context_ = 0x3f800000;
  *(undefined8 *)&this[1].super_Pass.already_run_ = 0;
  this[1].seen_target_vars_._M_h._M_buckets = (__buckets_ptr)0x0;
  this[1].seen_target_vars_._M_h._M_bucket_count = 0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this;
  *(undefined8 **)
   in_RDI._M_t.
   super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
   .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl = puVar1;
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
}

Assistant:

Optimizer::PassToken CreateCCPPass() {
  return MakeUnique<Optimizer::PassToken::Impl>(MakeUnique<opt::CCPPass>());
}